

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall amrex::StateData::copyNew(StateData *this,StateData *state)

{
  MultiFab *src;
  Real RVar1;
  
  src = (state->new_data)._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  MultiFab::Copy((this->new_data)._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,src,0,0,
                 *(int *)((long)&(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc),
                 ((IntVect *)
                 ((long)&(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xc0))->vect
                 [0]);
  RVar1 = (state->new_time).stop;
  (this->new_time).start = (state->new_time).start;
  (this->new_time).stop = RVar1;
  return;
}

Assistant:

void
StateData::copyNew (const StateData& state)
{
    const MultiFab& MF = state.newData();

    int nc = MF.nComp();
    int ng = MF.nGrow();

    BL_ASSERT(nc == (*new_data).nComp());
    BL_ASSERT(ng == (*new_data).nGrow());

    MultiFab::Copy(*new_data, state.newData(), 0, 0, nc, ng);

    new_time = state.new_time;
}